

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O3

int uripMatch(char *URI)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (URI != (char *)0x0) {
    iVar1 = strcmp(URI,"file:///etc/xml/catalog");
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = strcmp(urip_rcvsURLs[urip_current],URI);
      iVar2 = 1;
      if (iVar1 != 0) {
        urip_success = 1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
uripMatch(const char * URI) {
    if ((URI == NULL) || (!strcmp(URI, "file:///etc/xml/catalog")))
        return(0);
    /* Verify we received the escaped URL */
    if (strcmp(urip_rcvsURLs[urip_current], URI))
	urip_success = 0;
    return(1);
}